

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O0

void __thiscall bro::args_t::args_t(args_t *this,int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int *local_98;
  int *local_90;
  char **local_88;
  char *p;
  int *rhs_1;
  char **rhs;
  char *sw;
  char **__end4;
  char **__begin4;
  char *(*__range4) [22];
  char short_code;
  char *arg;
  int i;
  char **argv_local;
  int argc_local;
  args_t *this_local;
  
  this->force = false;
  this->verbose = false;
  this->decompress = false;
  this->no_copy_stat = false;
  this->input_file = (char *)0x0;
  this->output_file = (char *)0x0;
  this->custom_dictionary = (char *)0x0;
  this->quality = 0;
  this->repeat = 1;
  this->window = 0x16;
  this->fail = true;
  arg._4_4_ = 1;
  do {
    if (arg._4_4_ == argc) {
      if (this->quality < 100) {
        if ((this->window < 10) || (0x18 < this->window)) {
          error(this,"","window out of range",args_t::switches);
        }
        else {
          this->fail = false;
        }
      }
      else {
        error(this,"","quality out of range",args_t::switches);
      }
      return;
    }
    pcVar1 = argv[arg._4_4_];
    if (*pcVar1 != '-') {
      error(this,pcVar1,"unexpected argument",args_t::switches);
      return;
    }
    __range4._7_1_ = '\0';
    for (__end4 = args_t::switches; __end4 != &DW_ref___gxx_personality_v0; __end4 = __end4 + 1) {
      pcVar2 = *__end4;
      if (pcVar2[1] == '\0') {
        __range4._7_1_ = *pcVar2;
      }
      if ((*pcVar2 == pcVar1[1]) && (iVar3 = strcmp(pcVar2 + 1,pcVar1 + 2), iVar3 == 0)) {
        switch(__range4._7_1_) {
        case 'N':
          if (pcVar2[1] == '\0') {
            error(this,pcVar1,"unknown argument",args_t::switches);
            return;
          }
          this->no_copy_stat = true;
          break;
        default:
          error(this,pcVar1,"unknown argument",args_t::switches);
          return;
        case 'd':
        case 'u':
          this->decompress = true;
          break;
        case 'f':
          this->force = true;
          break;
        case 'i':
        case 'o':
          if (arg._4_4_ + 1 == argc) {
            error(this,pcVar1,"too few arguments",args_t::switches);
            return;
          }
          if ((__range4._7_1_ == 'D') && (pcVar2[1] == '\0')) {
            error(this,pcVar1,"unknown argument",args_t::switches);
            return;
          }
          if (__range4._7_1_ == 'i') {
            local_88 = &this->input_file;
          }
          else {
            local_88 = &this->output_file;
          }
          arg._4_4_ = arg._4_4_ + 1;
          *local_88 = argv[arg._4_4_];
          break;
        case 'q':
        case 'r':
        case 'w':
          if (arg._4_4_ + 1 == argc) {
            error(this,pcVar1,"too few arguments",args_t::switches);
            return;
          }
          if (__range4._7_1_ == 'q') {
            local_90 = &this->quality;
          }
          else {
            if (__range4._7_1_ == 'r') {
              local_98 = &this->repeat;
            }
            else {
              local_98 = &this->window;
            }
            local_90 = local_98;
          }
          *local_90 = 0;
          arg._4_4_ = arg._4_4_ + 1;
          pcVar1 = argv[arg._4_4_];
          while (*pcVar1 != '\0') {
            if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
              error(this,pcVar1,"expected number",args_t::switches);
              return;
            }
            *local_90 = *local_90 * 10 + (int)*pcVar1 + -0x30;
          }
          break;
        case 'v':
          this->verbose = true;
        }
        break;
      }
    }
    arg._4_4_ = arg._4_4_ + 1;
  } while( true );
}

Assistant:

args_t(int argc, const char **argv) {
      static const char *switches[] = {
        "f", "-force",
        "d", "-decompress", "-uncompress",
        "v", "-verbose",
        "N", "-no-copy-stat",
        "i", "-in", "-input",
        "o", "-out", "-output"
        "D", "-custom-dictionary",
        "q", "-quality",
        "r", "-repeat",
        "w", "-window",
      };

      for (int i = 1; i != argc; ++i) {
        const char *arg = argv[i];
        if (arg[0] == '-') {
          char short_code = '\0';
          for (auto sw : switches) {
            if (!sw[1]) short_code = sw[0];
            if (sw[0] == arg[1] && !strcmp(sw+1, arg+2)) {
              switch(short_code) {
                case 'f': {
                  force = true;
                } break;
                case 'd': case 'u': {
                  decompress = true;
                } break;
                case 'v': {
                  verbose = true;
                } break;
                case 'N': {
                  if (!sw[1]) { error(arg, "unknown argument", switches); return; }
                  no_copy_stat = true;
                } break;
                case 'i': case 'o': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  if (short_code == 'D' && !sw[1]) { error(arg, "unknown argument", switches); return; }
                  const char * &rhs = short_code == 'i' ? input_file : 'o' ? output_file : custom_dictionary;
                  rhs = argv[++i];
                } break;
                case 'q': case 'r': case 'w': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  int &rhs = short_code == 'q' ? quality : short_code == 'r' ? repeat : window;
                  rhs = 0;
                  const char *p = argv[++i];
                  while (*p) {
                    if (*p < '0' || *p > '9') { error(p, "expected number", switches); return; }
                    rhs = rhs * 10 + *p - '0';
                  }
                } break;
                default: {
                  error(arg, "unknown argument", switches); return;
                } break;
              }
              break;
            }
          }
        } else {
          error(arg, "unexpected argument", switches);
          return;
        }
      }

      if (quality > 99) {
        error("", "quality out of range", switches);
      } else if (window < 10 || window >= 25) {
        error("", "window out of range", switches);
      } else {
        fail = false;
      }
    }